

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_byte_for_non_strings.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 3;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    poVar1 = std::operator<<((ostream *)&std::cout,'A');
    std::operator<<(poVar1,"\n");
  }
  return 0;
}

Assistant:

int main() {
  std::array<std::byte, 3> bytes = {
    std::byte{ 0x41 },
    std::byte{ 0x41 },
    std::byte{ 0x41 }
  };
  for (auto const & byte : bytes) {
    std::cout << static_cast<unsigned char>(byte) << "\n";
  }
}